

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::TrackActivationObjectPropertyForDebugger
          (ByteCodeGenerator *this,DebuggerScope *debuggerScope,Symbol *symbol,
          DebuggerScopePropertyFlags flags,bool isFunctionDeclaration)

{
  RegSlot location;
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  undefined4 *puVar3;
  
  if (debuggerScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x16c,"(debuggerScope)","debuggerScope");
    if (!bVar2) goto LAB_00755eac;
    *puVar3 = 0;
  }
  if (symbol == (Symbol *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x16d,"(symbol)","symbol");
    if (!bVar2) {
LAB_00755eac:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = ShouldTrackDebuggerMetadata(this);
  if ((bVar2) && ((symbol->field_0x43 & 0x20) == 0)) {
    location = symbol->location;
    propertyId = Symbol::EnsurePosition(symbol,this);
    Js::ByteCodeWriter::AddPropertyToDebuggerScope
              (&this->m_writer,debuggerScope,location,propertyId,false,flags,isFunctionDeclaration);
    symbol->field_0x43 = symbol->field_0x43 | 0x20;
  }
  return;
}

Assistant:

void ByteCodeGenerator::TrackActivationObjectPropertyForDebugger(
    Js::DebuggerScope *debuggerScope,
    Symbol *symbol,
    Js::DebuggerScopePropertyFlags flags /*= Js::DebuggerScopePropertyFlags_None*/,
    bool isFunctionDeclaration /*= false*/)
{
    Assert(debuggerScope);
    Assert(symbol);

    // Only need to track activation object properties in debug mode.
    if (ShouldTrackDebuggerMetadata() && !symbol->GetIsTrackedForDebugger())
    {
        Js::RegSlot location = symbol->GetLocation();
        Js::PropertyId propertyId = symbol->EnsurePosition(this);

        this->Writer()->AddPropertyToDebuggerScope(
            debuggerScope,
            location,
            propertyId,
            /*shouldConsumeRegister*/ false,
            flags,
            isFunctionDeclaration);

        symbol->SetIsTrackedForDebugger(true);
    }
}